

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *rhs)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  size_type i;
  ulong local_18;
  
  sVar2 = size(in_RDI);
  sVar3 = size(in_RSI);
  if (sVar2 == sVar3) {
    local_18 = 0;
    while( true ) {
      sVar2 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cbae7);
      if (sVar2 <= local_18) break;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RSI->m_bits,local_18);
      uVar1 = *pvVar4;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&in_RDI->m_bits,local_18);
      *pvVar5 = uVar1 & *pvVar5;
      local_18 = local_18 + 1;
    }
    return in_RDI;
  }
  __assert_fail("size() == rhs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x31a,
                "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator&=(const dynamic_bitset<Block, Allocator> &) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

dynamic_bitset<Block, Allocator>&
dynamic_bitset<Block, Allocator>::operator&=(const dynamic_bitset& rhs)
{
    assert(size() == rhs.size());
    for (size_type i = 0; i < num_blocks(); ++i)
        m_bits[i] &= rhs.m_bits[i];
    return *this;
}